

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O3

string * __thiscall
libtorrent::pcp_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,pcp_error_category *this,int ev)

{
  allocator<char> local_9;
  
  if ((uint)ev < 0xe) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,message::msgs[(uint)ev],&local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Unknown error","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
	{
		static char const* msgs[] =
		{
			"success",
			"unsupported version",
			"not authorized",
			"malformed request",
			"unsupported opcode",
			"unsupported option",
			"malformed option",
			"network failure",
			"no resources",
			"unsupported protocol",
			"user exceeded quota",
			"cannot provide external",
			"address mismatch",
			"excessive remote peers",
		};
		if (ev < 0 || ev >= int(sizeof(msgs)/sizeof(msgs[0])))
			return "Unknown error";
		return msgs[ev];
	}